

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O3

void just_test_test_case_f_test_read_back_content(void)

{
  read_back_tester test;
  long *local_50 [2];
  long local_40 [2];
  directory local_30;
  
  just::temp::directory::directory(&local_30);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  anon_unknown.dwarf_a0fb::read_back_tester::operator()
            ((read_back_tester *)local_30._path._M_dataplus._M_p,
             (string *)local_30._path._M_string_length);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"hello world","");
  anon_unknown.dwarf_a0fb::read_back_tester::operator()
            ((read_back_tester *)local_30._path._M_dataplus._M_p,
             (string *)local_30._path._M_string_length);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"hello\nworld","");
  anon_unknown.dwarf_a0fb::read_back_tester::operator()
            ((read_back_tester *)local_30._path._M_dataplus._M_p,
             (string *)local_30._path._M_string_length);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"hello\rworld","");
  anon_unknown.dwarf_a0fb::read_back_tester::operator()
            ((read_back_tester *)local_30._path._M_dataplus._M_p,
             (string *)local_30._path._M_string_length);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"hello\r\nworld","");
  anon_unknown.dwarf_a0fb::read_back_tester::operator()
            ((read_back_tester *)local_30._path._M_dataplus._M_p,
             (string *)local_30._path._M_string_length);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  just::temp::directory::~directory(&local_30);
  return;
}

Assistant:

JUST_TEST_CASE(test_read_back_content)
{
  read_back_tester test;

  test("");
  test("hello world");
  test("hello\nworld");
  test("hello\rworld");
  test("hello\r\nworld");
}